

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O0

basic_db_leaf_unique_ptr<unsigned_long,_std::span<const_std::byte>,_header_type,_unodb::db>
unodb::detail::
make_db_leaf_ptr<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db>
          (art_key_type k,value_view v,
          db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *db)

{
  value_view v_00;
  basic_leaf<unsigned_long,_unodb::detail::node_header> *__p;
  size_type sVar1;
  length_error *this;
  size_t sVar2;
  _Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_false>
  extraout_RDX;
  db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *in_R8;
  basic_db_leaf_unique_ptr<unsigned_long,_std::span<const_std::byte>,_header_type,_unodb::db> bVar3;
  basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  local_70;
  db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *local_68;
  pointer local_60;
  size_t local_58;
  basic_leaf<unsigned_long,_unodb::detail::node_header> *local_50;
  byte *leaf_mem;
  unsigned_long size;
  db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *local_30;
  db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *db_local;
  value_view v_local;
  art_key_type k_local;
  
  db_local = (db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)
             v._M_extent._M_extent_value;
  v_local._M_extent._M_extent_value = (size_t)v._M_ptr;
  local_30 = in_R8;
  v_local._M_ptr = (pointer)db;
  sVar1 = std::span<const_std::byte,_18446744073709551615UL>::size_bytes
                    ((span<const_std::byte,_18446744073709551615UL> *)&db_local);
  if (0xffffffff < sVar1) {
    this = (length_error *)__cxa_allocate_exception(0x10);
    std::length_error::length_error(this,"Value length must fit in std::uint32_t");
    __cxa_throw(this,&std::length_error::typeinfo,std::length_error::~length_error);
  }
  sVar2 = basic_art_key<unsigned_long>::size((basic_art_key<unsigned_long> *)&v_local._M_extent);
  sVar1 = std::span<const_std::byte,_18446744073709551615UL>::size_bytes
                    ((span<const_std::byte,_18446744073709551615UL> *)&db_local);
  leaf_mem = (byte *)basic_leaf<unsigned_long,_unodb::detail::node_header>::compute_size
                               ((key_size_type)sVar2,(value_size_type)sVar1);
  local_50 = (basic_leaf<unsigned_long,_unodb::detail::node_header> *)
             allocate_aligned((size_t)leaf_mem,0x10);
  db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::increment_leaf_count
            (local_30,(size_t)leaf_mem);
  __p = local_50;
  local_58 = v_local._M_extent._M_extent_value;
  local_68 = db_local;
  local_60 = v_local._M_ptr;
  v_00._M_extent._M_extent_value = (size_t)v_local._M_ptr;
  v_00._M_ptr = (pointer)db_local;
  basic_leaf<unsigned_long,_unodb::detail::node_header>::basic_leaf
            (local_50,(art_key_type)v_local._M_extent._M_extent_value,v_00);
  basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::basic_db_leaf_deleter(&local_70,local_30);
  std::
  unique_ptr<unodb::detail::basic_leaf<unsigned_long,unodb::detail::node_header>,unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>>
  ::
  unique_ptr<unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>,void>
            ((unique_ptr<unodb::detail::basic_leaf<unsigned_long,unodb::detail::node_header>,unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>>
              *)k.field_0,__p,&local_70);
  bVar3._M_t.
  super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  .
  super__Head_base<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_false>
  ._M_head_impl = extraout_RDX._M_head_impl;
  bVar3._M_t.
  super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  .
  super__Tuple_impl<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  .
  super__Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
  ._M_head_impl.db =
       (_Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
        )(_Head_base<1UL,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
          )k.field_0;
  return (basic_db_leaf_unique_ptr<unsigned_long,_std::span<const_std::byte>,_header_type,_unodb::db>
          )bVar3._M_t.
           super___uniq_ptr_impl<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ;
}

Assistant:

[[nodiscard]] auto make_db_leaf_ptr(
    basic_art_key<Key> k, value_view v,
    Db<Key, Value> &db UNODB_DETAIL_LIFETIMEBOUND) {
  using db_type = Db<Key, Value>;
  using header_type = typename db_type::header_type;
  using leaf_type = basic_leaf<Key, header_type>;

  // TODO(thompsonbry) We should have a discussion about limits.  To
  // my mind, limits should be explicit configuration values, not
  // uint32_t.
  if constexpr (std::is_same_v<Key, key_view>) {
    if (UNODB_DETAIL_UNLIKELY(k.size() > leaf_type::max_key_size)) {
      throw std::length_error("Key length must fit in std::uint32_t");
    }
  }

  if (UNODB_DETAIL_UNLIKELY(v.size_bytes() > leaf_type::max_value_size)) {
    throw std::length_error("Value length must fit in std::uint32_t");
  }

  const auto size = leaf_type::compute_size(
      static_cast<typename leaf_type::key_size_type>(k.size()),
      static_cast<typename leaf_type::value_size_type>(v.size_bytes()));

  auto *const leaf_mem = static_cast<std::byte *>(
      allocate_aligned(size, alignment_for_new<leaf_type>()));

#ifdef UNODB_DETAIL_WITH_STATS
  db.increment_leaf_count(size);
#endif  // UNODB_DETAIL_WITH_STATS

  return basic_db_leaf_unique_ptr<Key, Value, header_type, Db>{
      new (leaf_mem) leaf_type{k, v}, basic_db_leaf_deleter<db_type>{db}};
}